

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O2

TValue * luaT_gettm(Table *events,TMS event,TString *ename)

{
  byte bVar1;
  TValue *pTVar2;
  
  pTVar2 = luaH_getshortstr(events,ename);
  if (pTVar2->tt_ == 0) {
    bVar1 = (byte)event & 0x1f;
    events->flags = events->flags | (byte)(1 << bVar1);
    pTVar2 = (TValue *)(ulong)(uint)(0 << bVar1);
  }
  return pTVar2;
}

Assistant:

const TValue *luaT_gettm(Table *events, TMS event, TString *ename) {
    const TValue *tm = luaH_getshortstr(events, ename);
    lua_assert(event <= TM_EQ);
    if (ttisnil(tm)) {  /* no tag method? */
        events->flags |= cast_byte(1u << event);  /* cache this fact */
        return NULL;
    } else return tm;
}